

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *m0,Matrix *m1)

{
  Matrix *pMVar1;
  string *__lhs;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Matrix *local_28;
  Matrix *m;
  Matrix *m1_local;
  Matrix *m0_local;
  
  m = m1;
  m1_local = m0;
  m0_local = __return_storage_ptr__;
  pMVar1 = (Matrix *)operator_new(0x100);
  Matrix::Matrix(pMVar1,m1_local);
  __lhs = &m1_local->sMatrixName;
  local_28 = pMVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," + ",&local_99);
  std::operator+(&local_78,__lhs,&local_98);
  std::operator+(&local_58,&local_78,&m->sMatrixName);
  std::__cxx11::string::operator=((string *)&local_28->sMatrixName,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pMVar1 = Matrix::operator+=(local_28,m);
  Matrix::Matrix(__return_storage_ptr__,pMVar1);
  return __return_storage_ptr__;
}

Assistant:

Matrix operator+(const Matrix &m0, const Matrix &m1)
{
	Matrix *m = new Matrix(m0);
	m->sMatrixName = m0.sMatrixName + string(" + ") + m1.sMatrixName;
	return m->operator+=( m1 );
}